

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

bool __thiscall duckdb_shell::ShellState::ImportData(ShellState *this,char **azArg,idx_t nArg)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char **ppcVar8;
  char *pcVar9;
  size_t sVar10;
  code *pcVar11;
  char cVar12;
  uint uVar13;
  undefined8 uVar14;
  FILE *__stream;
  ImportCtx *p;
  char *__s1;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  bool bVar19;
  sqlite3_stmt *pStmt;
  char zSep [2];
  int local_c4;
  sqlite3_stmt *local_c0;
  char *local_b8;
  char **local_b0;
  idx_t local_a8;
  int local_9c;
  ImportCtx local_98;
  ulong local_50;
  char *local_48;
  char local_3a [2];
  ulong local_38;
  
  local_b0 = azArg;
  if (safe_mode == '\x01') {
    ImportData();
  }
  else {
    pcVar7 = (char *)0x0;
    local_c0 = (sqlite3_stmt *)0x0;
    local_98.cRowSep = 0;
    local_98._68_4_ = 0;
    local_98.nErr = 0;
    local_98.bNotFirst = 0;
    local_98.cTerm = 0;
    local_98.cColSep = 0;
    local_98.n = 0;
    local_98.nAlloc = 0;
    local_98.nLine = 0;
    local_98.nRow = 0;
    local_98.xCloser = (_func_int_FILE_ptr *)0x0;
    local_98.z = (char *)0x0;
    local_98.zFile = (char *)0x0;
    local_98.in = (FILE *)0x0;
    pcVar11 = csv_read_one_field;
    if (this->mode == ASCII) {
      pcVar11 = ascii_read_one_field;
    }
    bVar19 = true;
    local_50 = CONCAT71(local_50._1_7_,nArg >= 2);
    if (nArg < 2) {
      pcVar9 = (char *)0x0;
      local_c4 = 0;
      local_b8 = (char *)0x0;
    }
    else {
      local_38 = nArg - 1;
      local_b8 = (char *)0x0;
      local_9c = 1;
      uVar16 = 1;
      local_c4 = 0;
      pcVar17 = (char *)0x0;
      pcVar18 = (char *)0x0;
      local_a8 = nArg;
      do {
        __s1 = local_b0[uVar16];
        if ((*__s1 == '-') && (__s1[1] == '-')) {
          __s1 = __s1 + 1;
        }
        pcVar7 = pcVar17;
        pcVar9 = pcVar18;
        if (*__s1 == '-') {
          iVar2 = strcmp(__s1,"-v");
          if (iVar2 == 0) {
            local_c4 = local_c4 + 1;
          }
          else {
            iVar2 = strcmp(__s1,"-skip");
            if ((local_38 <= uVar16) || (iVar2 != 0)) {
              iVar2 = strcmp(__s1,"-ascii");
              if (iVar2 == 0) {
                local_98.cColSep = 0x1f;
                local_98.cRowSep = 0x1e;
                bVar19 = true;
                local_9c = 0;
                pcVar11 = ascii_read_one_field;
                nArg = local_a8;
              }
              else {
                iVar2 = strcmp(__s1,"-csv");
                if (iVar2 != 0) {
                  __stream = (FILE *)this->out;
                  pcVar7 = "ERROR: unknown option: \"%s\".  Usage:\n";
                  goto LAB_00216856;
                }
                local_98.cColSep = 0x2c;
                local_98.cRowSep = 10;
                bVar19 = true;
                local_9c = 0;
                pcVar11 = csv_read_one_field;
                nArg = local_a8;
              }
              goto LAB_00216880;
            }
            lVar6 = uVar16 + 1;
            uVar16 = uVar16 + 1;
            local_b8 = (char *)integerValue(local_b0[lVar6]);
          }
          bVar19 = true;
          nArg = local_a8;
        }
        else {
          bVar19 = true;
          pcVar7 = __s1;
          if ((pcVar17 != (char *)0x0) && (pcVar7 = pcVar17, pcVar9 = __s1, pcVar18 != (char *)0x0))
          {
            __stream = (FILE *)this->out;
            pcVar7 = "ERROR: extra argument: \"%s\".  Usage:\n";
LAB_00216856:
            bVar19 = false;
            local_48 = pcVar17;
            fprintf(__stream,pcVar7,__s1);
            pcVar7 = local_48;
            showHelp(this->out,"import");
            nArg = local_a8;
            pcVar9 = pcVar18;
          }
        }
LAB_00216880:
        if (!bVar19) break;
        uVar16 = uVar16 + 1;
        local_50 = CONCAT71(local_50._1_7_,uVar16 < nArg);
        pcVar17 = pcVar7;
        pcVar18 = pcVar9;
      } while (uVar16 < nArg);
      bVar19 = local_9c != 0;
    }
    if ((local_50 & 1) == 0) {
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "FILE TABLE";
        if (pcVar7 == (char *)0x0) {
          pcVar9 = "?DB? FILE";
        }
        fprintf((FILE *)this->out,"ERROR: missing %s argument. Usage:\n",pcVar9 + 5);
        showHelp(this->out,"import");
        return false;
      }
      seenInterrupt = 0;
      OpenDB(this,0);
      if (bVar19) {
        iVar2 = (int)(this->colSeparator)._M_string_length;
        if (iVar2 == 0) {
          ImportData();
          return false;
        }
        if (1 < iVar2) {
          ImportData();
          return false;
        }
        iVar2 = (int)(this->rowSeparator)._M_string_length;
        if (iVar2 == 2) {
          iVar2 = 2;
          if (this->mode == CSV) {
            iVar3 = std::__cxx11::string::compare((char *)&this->rowSeparator);
            if (iVar3 == 0) {
              std::__cxx11::string::operator=
                        ((string *)&this->rowSeparator,anon_var_dwarf_647c26b + 8);
              iVar2 = (int)(this->rowSeparator)._M_string_length;
            }
          }
        }
        else if (iVar2 == 0) {
          ImportData();
          return false;
        }
        if (1 < iVar2) {
          ImportData();
          return false;
        }
        local_98.cColSep = (int)*(this->colSeparator)._M_dataplus._M_p;
        local_98.cRowSep = (int)*(this->rowSeparator)._M_dataplus._M_p;
      }
      local_98.nLine = 1;
      local_98.zFile = pcVar7;
      if (*pcVar7 == '|') {
        local_98.in = (FILE *)popen(pcVar7 + 1,"r");
        local_98.zFile = "<pipe>";
        local_98.xCloser = pclose;
      }
      else {
        local_98.in = (FILE *)fopen64(pcVar7,"rb");
        local_98.xCloser = fclose;
      }
      if ((FILE *)local_98.in == (FILE *)0x0) {
        fprintf(_stderr,"Error: cannot open \"%s\"\n",pcVar7);
        return false;
      }
      if (!(bool)(local_c4 < 2 & (bVar19 ^ 1U | local_c4 != 1))) {
        local_3a[1] = 0;
        local_3a[0] = (char)local_98.cColSep;
        fwrite("Column separator ",0x11,1,(FILE *)this->out);
        OutputCString(this,local_3a);
        fwrite(", row separator ",0x10,1,(FILE *)this->out);
        local_3a[0] = (char)local_98.cRowSep;
        OutputCString(this,local_3a);
        fputc(10,(FILE *)this->out);
      }
      if (0 < (int)local_b8) {
LAB_00216b2e:
        do {
          lVar6 = (*pcVar11)(&local_98);
          if (lVar6 != 0) {
            if (local_98.cTerm == local_98.cColSep) goto LAB_00216b2e;
          }
          iVar2 = (int)local_b8;
          local_b8 = (char *)(ulong)(iVar2 - 1);
        } while (1 < iVar2);
      }
      iVar2 = 0;
      local_b8 = pcVar9;
      pcVar7 = duckdb_shell_sqlite3_mprintf("SELECT * FROM %s",pcVar9);
      if (pcVar7 == (char *)0x0) {
        ImportData();
LAB_0021713e:
        if (((FILE *)local_98.in != (FILE *)0x0) && (local_98.xCloser != (_func_int_FILE_ptr *)0x0))
        {
          (*local_98.xCloser)(local_98.in);
          local_98.in = (FILE *)0x0;
        }
        p = (ImportCtx *)local_98.z;
        duckdb_shell_sqlite3_free(local_98.z);
        local_98.z = (char *)0x0;
        shell_out_of_memory();
        iVar2 = p->cColSep;
        iVar3 = p->cRowSep;
        p->n = 0;
        iVar4 = fgetc((FILE *)p->in);
        if ((iVar4 == -1) || (seenInterrupt != 0)) {
          p->cTerm = -1;
          uVar1 = 0;
        }
        else {
          bVar19 = iVar4 == iVar3;
          if (iVar4 != iVar2 && !bVar19) {
            do {
              import_append_char(p,iVar4);
              iVar4 = fgetc((FILE *)p->in);
              bVar19 = iVar4 == iVar3;
              if ((iVar4 == -1) || (iVar4 == iVar2)) break;
            } while (iVar4 != iVar3);
          }
          if (bVar19) {
            p->nLine = p->nLine + 1;
          }
          p->cTerm = iVar4;
          if (p->z != (char *)0x0) {
            p->z[p->n] = '\0';
          }
          uVar1 = SUB81(p->z,0);
        }
        return (bool)uVar1;
      }
      ppcVar8 = (char **)strlen(pcVar7);
      iVar3 = duckdb_shell_sqlite3_prepare_v2(this->db,pcVar7,-1,&local_c0,(char **)0x0);
      import_append_char(&local_98,0);
      if (iVar3 != 0) {
        pcVar9 = duckdb_shell_sqlite3_errmsg(this->db);
        iVar4 = duckdb_shell_sqlite3_strglob("Catalog Error: Table with name *",pcVar9);
        iVar2 = 1;
        if (iVar4 == 0) {
          local_50 = CONCAT44(local_50._4_4_,iVar3);
          local_b0 = ppcVar8;
          pcVar9 = duckdb_shell_sqlite3_mprintf("CREATE TABLE %s",local_b8);
          uVar14 = 0x28;
          do {
            cVar12 = (char)uVar14;
            lVar6 = (*pcVar11)(&local_98);
            if (lVar6 == 0) break;
            pcVar9 = duckdb_shell_sqlite3_mprintf("%z%c\n  \"%w\" TEXT",pcVar9,uVar14);
            uVar14 = 0x2c;
            cVar12 = ',';
          } while (local_98.cTerm == local_98.cColSep);
          if (cVar12 == '(') {
            ImportData();
            bVar19 = false;
            ppcVar8 = local_b0;
            iVar2 = (int)local_50;
          }
          else {
            pcVar9 = duckdb_shell_sqlite3_mprintf("%z\n)",pcVar9);
            ppcVar8 = local_b0;
            if (0 < local_c4) {
              fprintf((FILE *)this->out,"%s\n",pcVar9);
            }
            iVar2 = duckdb_shell_sqlite3_exec
                              (this->db,pcVar9,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
            duckdb_shell_sqlite3_free(pcVar9);
            if (iVar2 == 0) {
              iVar2 = duckdb_shell_sqlite3_prepare_v2(this->db,pcVar7,-1,&local_c0,(char **)0x0);
              bVar19 = true;
            }
            else {
              ImportData();
              bVar19 = false;
            }
          }
          if (!bVar19) {
            return false;
          }
        }
      }
      duckdb_shell_sqlite3_free(pcVar7);
      if (iVar2 == 0) {
        uVar5 = duckdb_shell_sqlite3_column_count(local_c0);
        duckdb_shell_sqlite3_finalize(local_c0);
        local_c0 = (sqlite3_stmt *)0x0;
        if (uVar5 == 0) {
          return false;
        }
        pcVar7 = (char *)duckdb_shell_sqlite3_malloc64
                                   ((long)(int)((uVar5 + (int)ppcVar8) * 2 + 0x14));
        if (pcVar7 == (char *)0x0) goto LAB_0021713e;
        duckdb_shell_sqlite3_snprintf
                  ((int)ppcVar8 + 0x14,pcVar7,"INSERT INTO \"%w\" VALUES(?",local_b8);
        sVar10 = strlen(pcVar7);
        if (1 < (int)uVar5) {
          sVar10 = (size_t)(int)sVar10;
          iVar2 = uVar5 - 1;
          do {
            (pcVar7 + sVar10)[0] = ',';
            (pcVar7 + sVar10)[1] = '?';
            sVar10 = sVar10 + 2;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        (pcVar7 + (int)sVar10)[0] = ')';
        (pcVar7 + (int)sVar10)[1] = '\0';
        if (1 < local_c4) {
          fprintf((FILE *)this->out,"Insert using: %s\n",pcVar7);
        }
        iVar2 = duckdb_shell_sqlite3_prepare_v2(this->db,pcVar7,-1,&local_c0,(char **)0x0);
        duckdb_shell_sqlite3_free(pcVar7);
        if (iVar2 == 0) {
          iVar2 = duckdb_shell_sqlite3_get_autocommit(this->db);
          local_a8 = CONCAT44(local_a8._4_4_,iVar2);
          if (iVar2 != 0) {
            duckdb_shell_sqlite3_exec
                      (this->db,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
          }
          local_b8 = (char *)CONCAT44(local_b8._4_4_,uVar5 - 1);
          local_50 = (ulong)-uVar5;
          do {
            local_b0 = (char **)CONCAT44(local_b0._4_4_,local_98.nLine);
            uVar13 = 0;
            if (0 < (int)uVar5) {
              uVar13 = 0;
              do {
                pcVar7 = (char *)(*pcVar11)(&local_98);
                if (uVar13 == 0) {
                  bVar19 = false;
                  uVar15 = 0;
                  if (pcVar7 != (char *)0x0) goto LAB_00216ec3;
                }
                else {
LAB_00216ec3:
                  uVar15 = uVar13;
                  if (this->mode == ASCII) {
                    if (pcVar7 == (char *)0x0) {
                      if (uVar13 != 0) goto LAB_00216ee7;
                    }
                    else if ((uVar13 != 0) || (*pcVar7 != '\0')) goto LAB_00216ee7;
                    bVar19 = false;
                  }
                  else {
LAB_00216ee7:
                    duckdb_shell_sqlite3_bind_text
                              (local_c0,uVar13 + 1,pcVar7,-1,
                               (_func_void_void_ptr *)0xffffffffffffffff);
                    bVar19 = true;
                    if (((int)uVar13 < (int)local_b8) && (local_98.cTerm != local_98.cColSep)) {
                      fprintf(_stderr,
                              "%s:%d: expected %d columns but found %d - filling the rest with NULL\n"
                              ,local_98.zFile,(ulong)local_b0 & 0xffffffff,(ulong)uVar5,
                              (ulong)(uVar13 + 1));
                      uVar16 = local_50;
                      uVar15 = uVar13 + 2;
                      uVar13 = uVar15;
                      if ((int)uVar15 <= (int)uVar5) {
                        do {
                          duckdb_shell_sqlite3_bind_null(local_c0,uVar13);
                          uVar15 = uVar13 + 1;
                          iVar2 = uVar13 + (int)uVar16;
                          uVar13 = uVar15;
                        } while (iVar2 != 0);
                      }
                    }
                  }
                }
                uVar13 = uVar15;
              } while ((bVar19) && (uVar13 = uVar15 + 1, (int)uVar13 < (int)uVar5));
            }
            if (local_98.cTerm == local_98.cColSep) {
              do {
                (*pcVar11)(&local_98);
                uVar13 = uVar13 + 1;
              } while (local_98.cTerm == local_98.cColSep);
              fprintf(_stderr,"%s:%d: expected %d columns but found %d - extras ignored\n",
                      local_98.zFile,(ulong)local_b0 & 0xffffffff,(ulong)uVar5,(ulong)uVar13);
            }
            if ((int)uVar5 <= (int)uVar13) {
              duckdb_shell_sqlite3_step(local_c0);
              iVar2 = duckdb_shell_sqlite3_reset(local_c0);
              if (iVar2 == 0) {
                local_98.nRow = local_98.nRow + 1;
              }
              else {
                ImportData();
              }
            }
            if (local_98.cTerm == -1) {
              if (((FILE *)local_98.in != (FILE *)0x0) &&
                 (local_98.xCloser != (_func_int_FILE_ptr *)0x0)) {
                (*local_98.xCloser)(local_98.in);
                local_98.in = (FILE *)0x0;
              }
              duckdb_shell_sqlite3_free(local_98.z);
              local_98.z = (char *)0x0;
              duckdb_shell_sqlite3_finalize(local_c0);
              if ((int)local_a8 != 0) {
                duckdb_shell_sqlite3_exec
                          (this->db,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
              }
              if (0 < local_c4) {
                fprintf((FILE *)this->out,"Added %d rows with %d errors using %d lines of input\n",
                        (ulong)local_98._40_8_ >> 0x20,local_98._48_8_ & 0xffffffff,
                        (ulong)(local_98.nLine - 1));
                return true;
              }
              return true;
            }
          } while( true );
        }
        pcVar7 = duckdb_shell_sqlite3_errmsg(this->db);
        PrintDatabaseError(this,pcVar7);
        if (local_c0 != (sqlite3_stmt *)0x0) {
          duckdb_shell_sqlite3_finalize(local_c0);
        }
      }
      else {
        if (local_c0 != (sqlite3_stmt *)0x0) {
          duckdb_shell_sqlite3_finalize(local_c0);
        }
        pcVar7 = duckdb_shell_sqlite3_errmsg(this->db);
        PrintDatabaseError(this,pcVar7);
      }
      if (((FILE *)local_98.in != (FILE *)0x0) && (local_98.xCloser != (_func_int_FILE_ptr *)0x0)) {
        (*local_98.xCloser)(local_98.in);
        local_98.in = (FILE *)0x0;
      }
      duckdb_shell_sqlite3_free(local_98.z);
    }
  }
  return false;
}

Assistant:

bool ShellState::ImportData(const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".import cannot be used in -safe mode\n");
		return false;
	}
	int rc;
	const char *zTable = nullptr;              /* Insert data into this table */
	const char *zFile = nullptr;               /* Name of file to extra content from */
	sqlite3_stmt *pStmt = nullptr;             /* A statement */
	int nCol;                                  /* Number of columns in the table */
	int nByte;                                 /* Number of bytes in an SQL string */
	int j;                                     /* Loop counters */
	int needCommit;                            /* True to COMMIT or ROLLBACK at end */
	char *zSql;                                /* An SQL statement */
	ImportCtx sCtx;                            /* Reader context */
	char *(SQLITE_CDECL * xRead)(ImportCtx *); /* Func to read one value */
	int eVerbose = 0;                          /* Larger for more console output */
	int nSkip = 0;                             /* Initial lines to skip */
	int useOutputMode = 1;                     /* Use output mode to determine separators */

	memset(&sCtx, 0, sizeof(sCtx));
	if (mode == RenderMode::ASCII) {
		xRead = ascii_read_one_field;
	} else {
		xRead = csv_read_one_field;
	}
	for (idx_t i = 1; i < nArg; i++) {
		auto z = azArg[i];
		if (z[0] == '-' && z[1] == '-')
			z++;
		if (z[0] != '-') {
			if (zFile == 0) {
				zFile = z;
			} else if (zTable == 0) {
				zTable = z;
			} else {
				utf8_printf(out, "ERROR: extra argument: \"%s\".  Usage:\n", z);
				showHelp(out, "import");
				return false;
			}
		} else if (strcmp(z, "-v") == 0) {
			eVerbose++;
		} else if (strcmp(z, "-skip") == 0 && i < nArg - 1) {
			nSkip = (int)integerValue(azArg[++i]);
		} else if (strcmp(z, "-ascii") == 0) {
			sCtx.cColSep = SEP_Unit[0];
			sCtx.cRowSep = SEP_Record[0];
			xRead = ascii_read_one_field;
			useOutputMode = 0;
		} else if (strcmp(z, "-csv") == 0) {
			sCtx.cColSep = ',';
			sCtx.cRowSep = '\n';
			xRead = csv_read_one_field;
			useOutputMode = 0;
		} else {
			utf8_printf(out, "ERROR: unknown option: \"%s\".  Usage:\n", z);
			showHelp(out, "import");
			return false;
		}
	}
	if (zTable == 0) {
		utf8_printf(out, "ERROR: missing %s argument. Usage:\n", zFile == 0 ? "FILE" : "TABLE");
		showHelp(out, "import");
		return false;
	}
	seenInterrupt = 0;
	OpenDB(0);
	if (useOutputMode) {
		/* If neither the --csv or --ascii options are specified, then set
		** the column and row separator characters from the output mode. */
		int nSep = colSeparator.size();
		if (nSep == 0) {
			raw_printf(stderr, "Error: non-null column separator required for import\n");
			return false;
		}
		if (nSep > 1) {
			raw_printf(stderr, "Error: multi-character column separators not allowed"
			                   " for import\n");
			return false;
		}
		nSep = rowSeparator.size();
		if (nSep == 0) {
			raw_printf(stderr, "Error: non-null row separator required for import\n");
			return false;
		}
		if (nSep == 2 && mode == RenderMode::CSV && rowSeparator == SEP_CrLf) {
			/* When importing CSV (only), if the row separator is set to the
			** default output row separator, change it to the default input
			** row separator.  This avoids having to maintain different input
			** and output row separators. */
			rowSeparator = SEP_Row;
			nSep = rowSeparator.size();
		}
		if (nSep > 1) {
			raw_printf(stderr, "Error: multi-character row separators not allowed"
			                   " for import\n");
			return false;
		}
		sCtx.cColSep = colSeparator[0];
		sCtx.cRowSep = rowSeparator[0];
	}
	sCtx.zFile = zFile;
	sCtx.nLine = 1;
	if (sCtx.zFile[0] == '|') {
#ifdef SQLITE_OMIT_POPEN
		raw_printf(stderr, "Error: pipes are not supported in this OS\n");
		rc = 1;
		goto meta_command_exit;
#else
		sCtx.in = popen(sCtx.zFile + 1, "r");
		sCtx.zFile = "<pipe>";
		sCtx.xCloser = pclose;
#endif
	} else {
		sCtx.in = fopen(sCtx.zFile, "rb");
		sCtx.xCloser = fclose;
	}
	if (sCtx.in == 0) {
		utf8_printf(stderr, "Error: cannot open \"%s\"\n", zFile);
		return false;
	}
	if (eVerbose >= 2 || (eVerbose >= 1 && useOutputMode)) {
		char zSep[2];
		zSep[1] = 0;
		zSep[0] = sCtx.cColSep;
		utf8_printf(out, "Column separator ");
		OutputCString(zSep);
		utf8_printf(out, ", row separator ");
		zSep[0] = sCtx.cRowSep;
		OutputCString(zSep);
		utf8_printf(out, "\n");
	}
	while ((nSkip--) > 0) {
		while (xRead(&sCtx) && sCtx.cTerm == sCtx.cColSep) {
		}
	}
	zSql = sqlite3_mprintf("SELECT * FROM %s", zTable);
	if (zSql == 0) {
		import_cleanup(&sCtx);
		shell_out_of_memory();
	}
	nByte = StringLength(zSql);
	rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	import_append_char(&sCtx, 0); /* To ensure sCtx.z is allocated */
	if (rc && sqlite3_strglob("Catalog Error: Table with name *", sqlite3_errmsg(db)) == 0) {
		char *zCreate = sqlite3_mprintf("CREATE TABLE %s", zTable);
		char cSep = '(';
		while (xRead(&sCtx)) {
			zCreate = sqlite3_mprintf("%z%c\n  \"%w\" TEXT", zCreate, cSep, sCtx.z);
			cSep = ',';
			if (sCtx.cTerm != sCtx.cColSep)
				break;
		}
		if (cSep == '(') {
			sqlite3_free(zCreate);
			import_cleanup(&sCtx);
			utf8_printf(stderr, "%s: empty file\n", sCtx.zFile);
			return false;
		}
		zCreate = sqlite3_mprintf("%z\n)", zCreate);
		if (eVerbose >= 1) {
			utf8_printf(out, "%s\n", zCreate);
		}
		rc = sqlite3_exec(db, zCreate, 0, 0, 0);
		sqlite3_free(zCreate);
		if (rc) {
			utf8_printf(stderr, "CREATE TABLE %s(...) failed: %s\n", zTable, sqlite3_errmsg(db));
			import_cleanup(&sCtx);
			return false;
		}
		rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	}
	sqlite3_free(zSql);
	if (rc) {
		if (pStmt)
			sqlite3_finalize(pStmt);
		ShellDatabaseError(db);
		import_cleanup(&sCtx);
		return false;
	}
	nCol = sqlite3_column_count(pStmt);
	sqlite3_finalize(pStmt);
	pStmt = 0;
	if (nCol == 0)
		return 0; /* no columns, no error */
	zSql = (char *)sqlite3_malloc64(nByte * 2 + 20 + nCol * 2);
	if (zSql == 0) {
		import_cleanup(&sCtx);
		shell_out_of_memory();
	}
	sqlite3_snprintf(nByte + 20, zSql, "INSERT INTO \"%w\" VALUES(?", zTable);
	j = StringLength(zSql);
	for (int i = 1; i < nCol; i++) {
		zSql[j++] = ',';
		zSql[j++] = '?';
	}
	zSql[j++] = ')';
	zSql[j] = 0;
	if (eVerbose >= 2) {
		utf8_printf(out, "Insert using: %s\n", zSql);
	}
	rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	sqlite3_free(zSql);
	if (rc) {
		ShellDatabaseError(db);
		if (pStmt)
			sqlite3_finalize(pStmt);
		import_cleanup(&sCtx);
		return false;
	}
	needCommit = sqlite3_get_autocommit(db);
	if (needCommit)
		sqlite3_exec(db, "BEGIN", 0, 0, 0);
	do {
		int startLine = sCtx.nLine;
		int i;
		for (i = 0; i < nCol; i++) {
			char *z = xRead(&sCtx);
			/*
			** Did we reach end-of-file before finding any columns?
			** If so, stop instead of NULL filling the remaining columns.
			*/
			if (z == 0 && i == 0)
				break;
			/*
			** Did we reach end-of-file OR end-of-line before finding any
			** columns in ASCII mode?  If so, stop instead of NULL filling
			** the remaining columns.
			*/
			if (mode == RenderMode::ASCII && (z == 0 || z[0] == 0) && i == 0)
				break;
			sqlite3_bind_text(pStmt, i + 1, z, -1, SQLITE_TRANSIENT);
			if (i < nCol - 1 && sCtx.cTerm != sCtx.cColSep) {
				utf8_printf(stderr,
				            "%s:%d: expected %d columns but found %d - "
				            "filling the rest with NULL\n",
				            sCtx.zFile, startLine, nCol, i + 1);
				i += 2;
				while (i <= nCol) {
					sqlite3_bind_null(pStmt, i);
					i++;
				}
			}
		}
		if (sCtx.cTerm == sCtx.cColSep) {
			do {
				xRead(&sCtx);
				i++;
			} while (sCtx.cTerm == sCtx.cColSep);
			utf8_printf(stderr,
			            "%s:%d: expected %d columns but found %d - "
			            "extras ignored\n",
			            sCtx.zFile, startLine, nCol, i);
		}
		if (i >= nCol) {
			sqlite3_step(pStmt);
			rc = sqlite3_reset(pStmt);
			if (rc != SQLITE_OK) {
				utf8_printf(stderr, "%s:%d: INSERT failed: %s\n", sCtx.zFile, startLine, sqlite3_errmsg(db));
				sCtx.nErr++;
			} else {
				sCtx.nRow++;
			}
		}
	} while (sCtx.cTerm != EOF);

	import_cleanup(&sCtx);
	sqlite3_finalize(pStmt);
	if (needCommit)
		sqlite3_exec(db, "COMMIT", 0, 0, 0);
	if (eVerbose > 0) {
		utf8_printf(out, "Added %d rows with %d errors using %d lines of input\n", sCtx.nRow, sCtx.nErr,
		            sCtx.nLine - 1);
	}
	return true;
}